

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

Split * __thiscall
embree::avx::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
::findFallback(Split *__return_storage_ptr__,
              BuilderT<embree::NodeRefPtr<8>,_embree::avx::RecalculatePrimRef<embree::TriangleMesh>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<8>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<8>,_8>::Set,_embree::avx::CreateMSMBlurLeaf<8,_embree::TriangleMesh,_embree::TriangleMi<4>_>,_embree::Scene::BuildProgressMonitorInterface>
              *this,SetMB *set)

{
  BBox1f BVar1;
  ulong uVar2;
  PrimRefMB *pPVar3;
  float fVar4;
  uint uVar5;
  float *pfVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_register_00001444 [12];
  
  uVar7 = (set->super_PrimInfoMB).object_range._begin;
  uVar2 = (set->super_PrimInfoMB).object_range._end;
  if (uVar2 == uVar7) {
LAB_013f6ce9:
    uVar5 = 1;
    if (((this->cfg).singleLeafTimeSegment == true) && (bVar9 = uVar7 < uVar2, bVar9)) {
      pfVar6 = &set->prims->items[uVar7].time_range.upper;
      do {
        uVar7 = uVar7 + 1;
        auVar10._0_4_ = (float)(uint)pfVar6[-2];
        auVar10._4_12_ = in_register_00001444;
        BVar1 = *(BBox1f *)(pfVar6 + -1);
        auVar12._8_8_ = 0;
        auVar12._0_4_ = BVar1.lower;
        auVar12._4_4_ = BVar1.upper;
        fVar11 = BVar1.lower;
        auVar12 = vmovshdup_avx(auVar12);
        fVar4 = auVar12._0_4_ - fVar11;
        auVar12 = ZEXT416((uint)((((set->super_PrimInfoMB).time_range.lower - fVar11) / fVar4) *
                                 1.0000002 * auVar10._0_4_));
        auVar12 = vroundss_avx(auVar12,auVar12,9);
        auVar12 = vmaxss_avx(ZEXT816(0) << 0x40,auVar12);
        auVar13 = ZEXT416((uint)((((set->super_PrimInfoMB).time_range.upper - fVar11) / fVar4) *
                                 0.99999976 * auVar10._0_4_));
        auVar13 = vroundss_avx(auVar13,auVar13,10);
        auVar13 = vminss_avx(auVar13,auVar10);
        if (1 < (int)auVar13._0_4_ - (int)auVar12._0_4_) {
          fVar4 = ((BBox1f *)(pfVar6 + -1))->lower;
          fVar11 = *pfVar6;
          __return_storage_ptr__->sah = 0.0;
          __return_storage_ptr__->dim = 0;
          (__return_storage_ptr__->field_2).fpos =
               fVar4 + ((fVar11 - fVar4) * (float)(((int)auVar13._0_4_ + (int)auVar12._0_4_) / 2)) /
                       auVar10._0_4_;
          __return_storage_ptr__->data = 2;
          if (bVar9) {
            return __return_storage_ptr__;
          }
          break;
        }
        bVar9 = uVar7 < uVar2;
        pfVar6 = pfVar6 + 0x14;
      } while (uVar7 != uVar2);
    }
  }
  else {
    pPVar3 = set->prims->items;
    pfVar6 = pPVar3[uVar7 + 1].lbounds.bounds0.lower.field_0.m128 + 3;
    uVar8 = uVar7;
    do {
      uVar8 = uVar8 + 1;
      if (uVar2 <= uVar8) goto LAB_013f6ce9;
      fVar4 = *pfVar6;
      pfVar6 = pfVar6 + 0x14;
    } while (fVar4 == pPVar3[uVar7].lbounds.bounds0.lower.field_0.m128[3]);
    uVar5 = 3;
  }
  __return_storage_ptr__->sah = 0.0;
  __return_storage_ptr__->dim = 0;
  (__return_storage_ptr__->field_2).pos = 0;
  __return_storage_ptr__->data = uVar5;
  return __return_storage_ptr__;
}

Assistant:

__noinline Split findFallback(const SetMB& set)
          {
            /* split if primitives are not from same geometry */
            if (!sameGeometry(set))
              return Split(0.0f,Split::SPLIT_GEOMID);
            
            /* if a leaf can only hold a single time-segment, we might have to do additional temporal splits */
            if (cfg.singleLeafTimeSegment)
            {
              /* test if one primitive has more than one time segment in time range, if so split time */
              for (size_t i=set.begin(); i<set.end(); i++)
              {
                const PrimRefMB& prim = (*set.prims)[i];
                const range<int> itime_range = prim.timeSegmentRange(set.time_range);
                const int localTimeSegments = itime_range.size();
                assert(localTimeSegments > 0);
                if (localTimeSegments > 1) {
                  const int icenter = (itime_range.begin() + itime_range.end())/2;
                  const float splitTime = prim.timeStep(icenter);
                  return Split(0.0f,(unsigned)Split::SPLIT_TEMPORAL,0,splitTime);
                }
              }
            }        

            /* otherwise return fallback split */
            return Split(0.0f,Split::SPLIT_FALLBACK);
          }